

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Souperify.cpp
# Opt level: O1

void __thiscall
wasm::DataFlow::Trace::addPathTo
          (Trace *this,Expression *parent,Expression *curr,
          vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *conditions)

{
  pointer *pppNVar1;
  iterator __position;
  long lVar2;
  Node *local_18;
  Node *condition;
  
  if (parent->_id != IfId) {
    handle_unreachable("invalid expr",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Souperify.cpp"
                       ,0x163);
  }
  if ((Expression *)parent[1].type.id == curr) {
    lVar2 = 0;
  }
  else {
    lVar2 = 1;
    if (*(Expression **)(parent + 2) != curr) {
      handle_unreachable("invalid expr",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Souperify.cpp"
                         ,0x15a);
    }
  }
  local_18 = (conditions->
             super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>).
             _M_impl.super__Vector_impl_data._M_start[lVar2];
  add(this,local_18,0);
  __position._M_current =
       (this->pathConditions).
       super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->pathConditions).
      super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<wasm::DataFlow::Node*,std::allocator<wasm::DataFlow::Node*>>::
    _M_realloc_insert<wasm::DataFlow::Node*const&>
              ((vector<wasm::DataFlow::Node*,std::allocator<wasm::DataFlow::Node*>> *)
               &this->pathConditions,__position,&local_18);
  }
  else {
    *__position._M_current = local_18;
    pppNVar1 = &(this->pathConditions).
                super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  return;
}

Assistant:

void addPathTo(Expression* parent,
                 Expression* curr,
                 std::vector<Node*> conditions) {
    if (auto* iff = parent->dynCast<If>()) {
      Index index;
      if (curr == iff->ifTrue) {
        index = 0;
      } else if (curr == iff->ifFalse) {
        index = 1;
      } else {
        WASM_UNREACHABLE("invalid expr");
      }
      auto* condition = conditions[index];
      // Add the condition itself as an instruction in the trace -
      // the pc uses it as its input.
      add(condition, 0);
      // Add it as a pc, which we will emit directly.
      pathConditions.push_back(condition);
    } else {
      WASM_UNREACHABLE("invalid expr");
    }
  }